

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O1

uint8 * __thiscall
google::protobuf::MessageLite::SerializeWithCachedSizesToArray(MessageLite *this,uint8 *target)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  LogMessage *other;
  EpsCopyOutputStream out;
  LogFinisher local_91;
  LogMessage local_90;
  uint8 *local_58;
  undefined8 local_50;
  undefined8 local_28;
  undefined2 local_20;
  byte local_1e;
  
  iVar1 = (*this->_vptr_MessageLite[10])();
  local_1e = io::CodedOutputStream::default_serialization_deterministic_ & 1;
  local_50 = 0;
  local_28 = 0;
  local_20 = 0;
  local_58 = target + iVar1;
  iVar2 = (*this->_vptr_MessageLite[0xc])(this,target);
  if (target + iVar1 != (uint8 *)CONCAT44(extraout_var,iVar2)) {
    internal::LogMessage::LogMessage
              (&local_90,LOGLEVEL_DFATAL,"third_party/protobuf-lite/message_lite.cc",0x168);
    other = internal::LogMessage::operator<<(&local_90,"CHECK failed: target + size == res: ");
    internal::LogFinisher::operator=(&local_91,other);
    internal::LogMessage::~LogMessage(&local_90);
  }
  return (uint8 *)CONCAT44(extraout_var,iVar2);
}

Assistant:

uint8* MessageLite::SerializeWithCachedSizesToArray(uint8* target) const {
  // We only optimize this when using optimize_for = SPEED.  In other cases
  // we just use the CodedOutputStream path.
  return SerializeToArrayImpl(*this, target, GetCachedSize());
}